

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int GetSSE(uint8_t *a,uint8_t *b,int w,int h)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  for (iVar3 = 0; iVar3 != h; iVar3 = iVar3 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      iVar1 = iVar1 + ((uint)a[uVar4] - (uint)b[uVar4]) * ((uint)a[uVar4] - (uint)b[uVar4]);
    }
    a = a + 0x20;
    b = b + 0x20;
  }
  return iVar1;
}

Assistant:

static WEBP_INLINE int GetSSE(const uint8_t* a, const uint8_t* b,
                              int w, int h) {
  int count = 0;
  int y, x;
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      const int diff = (int)a[x] - b[x];
      count += diff * diff;
    }
    a += BPS;
    b += BPS;
  }
  return count;
}